

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O0

void Sat_SolverClauseWriteDimacs(FILE *pFile,clause *pC,int fIncrement)

{
  int iVar1;
  char *pcVar2;
  int local_20;
  int i;
  int fIncrement_local;
  clause *pC_local;
  FILE *pFile_local;
  
  for (local_20 = 0; local_20 < (int)((uint)*pC >> 0xb); local_20 = local_20 + 1) {
    iVar1 = lit_sign((lit)pC[(long)local_20 + 1]);
    pcVar2 = "";
    if (iVar1 != 0) {
      pcVar2 = "-";
    }
    iVar1 = lit_var((lit)pC[(long)local_20 + 1]);
    fprintf((FILE *)pFile,"%s%d ",pcVar2,(ulong)(iVar1 + (uint)(0 < fIncrement)));
  }
  if (fIncrement != 0) {
    fprintf((FILE *)pFile,"0");
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Sat_SolverClauseWriteDimacs( FILE * pFile, clause * pC, int fIncrement )
{
    int i;
    for ( i = 0; i < (int)pC->size; i++ )
        fprintf( pFile, "%s%d ", (lit_sign(pC->lits[i])? "-": ""),  lit_var(pC->lits[i]) + (fIncrement>0) );
    if ( fIncrement )
        fprintf( pFile, "0" );
    fprintf( pFile, "\n" );
}